

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.h
# Opt level: O0

void printTimestamp(int timestamp)

{
  int hours;
  int minutes;
  int seconds;
  int timestamp_local;
  
  printf("%.2d:%.2d:%.2d",(ulong)(uint)(((timestamp / 0x3c) / 0x3c) % 0x3c),
         (ulong)(uint)((timestamp / 0x3c) % 0x3c),(ulong)(uint)(timestamp % 0x3c));
  return;
}

Assistant:

static void printTimestamp(int timestamp)
{
    const int seconds = timestamp % 60;
    timestamp /= 60;
    const int minutes = timestamp % 60;
    timestamp /= 60;
    const int hours = timestamp % 60;
    printf("%.2d:%.2d:%.2d", hours, minutes, seconds);
}